

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_layout.cpp
# Opt level: O1

void __thiscall
duckdb::RowLayout::Initialize(RowLayout *this,vector<duckdb::LogicalType,_true> *types_p,bool align)

{
  idx_t *__args;
  PhysicalType type;
  pointer puVar1;
  pointer pLVar2;
  iterator __position;
  bool bVar3;
  idx_t iVar4;
  ulong uVar5;
  iterator __end1;
  LogicalType *type_1;
  pointer pLVar6;
  vector<duckdb::LogicalType,_true> *__range1;
  iterator __begin1;
  
  puVar1 = (this->offsets).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->offsets).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar1) {
    (this->offsets).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar1;
  }
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::_M_move_assign
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)this);
  pLVar6 = (this->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
           super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
           super__Vector_impl_data._M_start;
  pLVar2 = (this->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
           super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
           super__Vector_impl_data._M_finish;
  uVar5 = ((long)pLVar2 - (long)pLVar6 >> 3) * -0x5555555555555555 + 7U >> 3;
  this->flag_width = uVar5;
  this->row_width = uVar5;
  for (; pLVar2 != pLVar6; pLVar6 = pLVar6 + 1) {
    if (this->all_constant == true) {
      bVar3 = TypeIsConstantSize(pLVar6->physical_type_);
    }
    else {
      bVar3 = false;
    }
    this->all_constant = bVar3;
  }
  if (this->all_constant == false) {
    this->heap_pointer_offset = this->row_width;
    this->row_width = this->row_width + 8;
  }
  __args = &this->row_width;
  pLVar6 = (this->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
           super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
           super__Vector_impl_data._M_start;
  pLVar2 = (this->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
           super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pLVar6 != pLVar2) {
    do {
      __position._M_current =
           (this->offsets).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->offsets).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        ::std::vector<unsigned_long,std::allocator<unsigned_long>>::
        _M_realloc_insert<unsigned_long_const&>
                  ((vector<unsigned_long,std::allocator<unsigned_long>> *)&this->offsets,__position,
                   __args);
      }
      else {
        *__position._M_current = this->row_width;
        (this->offsets).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      type = pLVar6->physical_type_;
      bVar3 = TypeIsConstantSize(type);
      iVar4 = 8;
      if ((~bVar3 & type != VARCHAR) == 0) {
        iVar4 = GetTypeIdSize(pLVar6->physical_type_);
      }
      *__args = *__args + iVar4;
      pLVar6 = pLVar6 + 1;
    } while (pLVar6 != pLVar2);
  }
  this->data_width = this->row_width - this->flag_width;
  if (align) {
    *__args = this->row_width + 7 & 0xfffffffffffffff8;
  }
  return;
}

Assistant:

void RowLayout::Initialize(vector<LogicalType> types_p, bool align) {
	offsets.clear();
	types = std::move(types_p);

	// Null mask at the front - 1 bit per value.
	flag_width = ValidityBytes::ValidityMaskSize(types.size());
	row_width = flag_width;

	// Whether all columns are constant size.
	for (const auto &type : types) {
		all_constant = all_constant && TypeIsConstantSize(type.InternalType());
	}

	// This enables pointer swizzling for out-of-core computation.
	if (!all_constant) {
		// When unswizzled, the pointer lives here.
		// When swizzled, the pointer is replaced by an offset.
		heap_pointer_offset = row_width;
		// The 8 byte pointer will be replaced with an 8 byte idx_t when swizzled.
		// However, this cannot be sizeof(data_ptr_t), since 32 bit builds use 4 byte pointers.
		row_width += sizeof(idx_t);
	}

	// Data columns. No alignment required.
	for (const auto &type : types) {
		offsets.push_back(row_width);
		const auto internal_type = type.InternalType();
		if (TypeIsConstantSize(internal_type) || internal_type == PhysicalType::VARCHAR) {
			row_width += GetTypeIdSize(type.InternalType());
		} else {
			// Variable size types use pointers to the actual data (can be swizzled).
			// Again, we would use sizeof(data_ptr_t), but this is not guaranteed to be equal to sizeof(idx_t).
			row_width += sizeof(idx_t);
		}
	}

	data_width = row_width - flag_width;

	// Alignment padding for the next row
	if (align) {
		row_width = AlignValue(row_width);
	}
}